

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_widget_text(nk_command_buffer *o,nk_rect b,char *string,int len,nk_text *t,nk_flags a,
                   nk_user_font *f)

{
  float fVar1;
  nk_rect r;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float fStack_58;
  float text_width;
  nk_rect label;
  nk_user_font *f_local;
  nk_flags a_local;
  nk_text *t_local;
  int len_local;
  char *string_local;
  nk_command_buffer *o_local;
  nk_rect b_local;
  
  if (o == (nk_command_buffer *)0x0) {
    __assert_fail("o",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x3135,
                  "void nk_widget_text(struct nk_command_buffer *, struct nk_rect, const char *, int, const struct nk_text *, nk_flags, const struct nk_user_font *)"
                 );
  }
  if (t != (nk_text *)0x0) {
    if ((o != (nk_command_buffer *)0x0) && (t != (nk_text *)0x0)) {
      b_local.y = b.h;
      if ((t->padding).y * 2.0 <= b_local.y) {
        local_60 = b_local.y;
      }
      else {
        local_60 = (t->padding).y * 2.0;
      }
      b_local.x = b.w;
      o_local._4_4_ = b.y;
      text_width = o_local._4_4_ + (t->padding).y;
      fVar1 = (t->padding).y;
      if (local_60 - (fVar1 + fVar1) <= f->height) {
        fVar1 = (t->padding).y;
        local_64 = local_60 - (fVar1 + fVar1);
      }
      else {
        local_64 = f->height;
      }
      label.y = local_64;
      local_6c = (*f->width)(f->userdata,f->height,string,len);
      fVar1 = (t->padding).x;
      local_6c = fVar1 + fVar1 + local_6c;
      o_local._0_4_ = b.x;
      if ((a & 1) == 0) {
        if ((a & 2) == 0) {
          if ((a & 4) == 0) {
            return;
          }
          fVar1 = (t->padding).x;
          if ((o_local._0_4_ + b_local.x) - (fVar1 + fVar1 + local_6c) <=
              o_local._0_4_ + (t->padding).x) {
            local_78 = o_local._0_4_ + (t->padding).x;
          }
          else {
            fVar1 = (t->padding).x;
            local_78 = (o_local._0_4_ + b_local.x) - (fVar1 + fVar1 + local_6c);
          }
          fStack_58 = local_78;
          fVar1 = (t->padding).x;
          label.x = fVar1 + fVar1 + local_6c;
        }
        else {
          fVar1 = (t->padding).x;
          if (fVar1 + fVar1 + local_6c <= 1.0) {
            local_6c = 1.0;
          }
          else {
            fVar1 = (t->padding).x;
            local_6c = fVar1 + fVar1 + local_6c;
          }
          fVar1 = (t->padding).x;
          local_70 = o_local._0_4_ + (t->padding).x +
                     ((b_local.x - (fVar1 + fVar1)) - local_6c) / 2.0;
          if (local_70 <= o_local._0_4_ + (t->padding).x) {
            local_70 = o_local._0_4_ + (t->padding).x;
          }
          fStack_58 = local_70;
          if (local_70 + local_6c <= o_local._0_4_ + b_local.x) {
            local_74 = local_70 + local_6c;
          }
          else {
            local_74 = o_local._0_4_ + b_local.x;
          }
          label.x = local_74;
          if (local_70 <= local_74) {
            label.x = local_74 - local_70;
          }
        }
      }
      else {
        fStack_58 = o_local._0_4_ + (t->padding).x;
        fVar1 = (t->padding).x;
        if (b_local.x - (fVar1 + fVar1) <= 0.0) {
          local_68 = 0.0;
        }
        else {
          fVar1 = (t->padding).x;
          local_68 = b_local.x - (fVar1 + fVar1);
        }
        label.x = local_68;
      }
      if ((a & 0x10) == 0) {
        if ((a & 0x20) != 0) {
          text_width = (o_local._4_4_ + local_60) - f->height;
          label.y = f->height;
        }
      }
      else {
        text_width = (o_local._4_4_ + local_60 / 2.0) - f->height / 2.0;
        if (local_60 - (local_60 / 2.0 + f->height / 2.0) <= local_60 / 2.0) {
          local_7c = local_60 / 2.0;
        }
        else {
          local_7c = local_60 - (local_60 / 2.0 + f->height / 2.0);
        }
        label.y = local_7c;
      }
      r.y = text_width;
      r.x = fStack_58;
      r.w = label.x;
      r.h = label.y;
      nk_draw_text(o,r,string,len,f,t->background,t->text);
    }
    return;
  }
  __assert_fail("t",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x3136,
                "void nk_widget_text(struct nk_command_buffer *, struct nk_rect, const char *, int, const struct nk_text *, nk_flags, const struct nk_user_font *)"
               );
}

Assistant:

NK_INTERN void
nk_widget_text(struct nk_command_buffer *o, struct nk_rect b,
    const char *string, int len, const struct nk_text *t,
    nk_flags a, const struct nk_user_font *f)
{
    struct nk_rect label;
    float text_width;

    NK_ASSERT(o);
    NK_ASSERT(t);
    if (!o || !t) return;

    b.h = NK_MAX(b.h, 2 * t->padding.y);
    label.x = 0; label.w = 0;
    label.y = b.y + t->padding.y;
    label.h = NK_MIN(f->height, b.h - 2 * t->padding.y);

    text_width = f->width(f->userdata, f->height, (const char*)string, len);
    text_width += (2.0f * t->padding.x);

    /* align in x-axis */
    if (a & NK_TEXT_ALIGN_LEFT) {
        label.x = b.x + t->padding.x;
        label.w = NK_MAX(0, b.w - 2 * t->padding.x);
    } else if (a & NK_TEXT_ALIGN_CENTERED) {
        label.w = NK_MAX(1, 2 * t->padding.x + (float)text_width);
        label.x = (b.x + t->padding.x + ((b.w - 2 * t->padding.x) - label.w) / 2);
        label.x = NK_MAX(b.x + t->padding.x, label.x);
        label.w = NK_MIN(b.x + b.w, label.x + label.w);
        if (label.w >= label.x) label.w -= label.x;
    } else if (a & NK_TEXT_ALIGN_RIGHT) {
        label.x = NK_MAX(b.x + t->padding.x, (b.x + b.w) - (2 * t->padding.x + (float)text_width));
        label.w = (float)text_width + 2 * t->padding.x;
    } else return;

    /* align in y-axis */
    if (a & NK_TEXT_ALIGN_MIDDLE) {
        label.y = b.y + b.h/2.0f - (float)f->height/2.0f;
        label.h = NK_MAX(b.h/2.0f, b.h - (b.h/2.0f + f->height/2.0f));
    } else if (a & NK_TEXT_ALIGN_BOTTOM) {
        label.y = b.y + b.h - f->height;
        label.h = f->height;
    }
    nk_draw_text(o, label, (const char*)string,
        len, f, t->background, t->text);
}